

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O3

void calc_mean_and_sd_weighted<float,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>
               (size_t *ix_arr,size_t st,size_t end,float *x,
               robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               *w,MissingAction missing_action,double *x_sd,double *x_mean)

{
  size_t row;
  size_t *key;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble lVar1;
  longdouble lVar2;
  double dVar3;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar4;
  tuple<> local_b9;
  longdouble local_b8;
  float local_ac;
  float local_a8;
  longdouble local_a4;
  long local_98;
  ushort uStack_90;
  long local_88;
  ushort uStack_80;
  longdouble local_74;
  _Head_base<0UL,_const_unsigned_long_&,_false> local_60;
  longdouble local_54;
  longdouble local_48;
  longdouble local_3c;
  
  key = ix_arr + st;
  do {
    local_a8 = x[*key];
    local_48 = (longdouble)local_a8;
    if (NAN(local_a8)) {
      if (end < st) {
LAB_0028a392:
        local_3c = (longdouble)NAN;
        dVar3 = 0.0;
        if (st <= end) {
          local_3c = (longdouble)0;
          local_b8 = local_3c;
          local_a4 = local_3c;
          do {
            local_ac = x[*key];
            local_74 = (longdouble)local_ac;
            local_98 = SUB108(local_74,0);
            uStack_90 = (ushort)((unkuint10)local_74 >> 0x40);
            if ((!NAN(local_ac)) && ((~uStack_90 & 0x7fff) != 0 || local_98 != -0x8000000000000000))
            {
              local_60._M_head_impl = key;
              pVar4 = tsl::detail_robin_hash::
                      robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                      ::
                      insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                                ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                  *)w,key,(piecewise_construct_t *)&std::piecewise_construct,
                                 (tuple<const_unsigned_long_&> *)&local_60,&local_b9);
              local_54 = (longdouble)*(double *)((pVar4.first.m_bucket.m_bucket)->m_value + 8);
              local_a4 = local_a4 + local_54;
              lVar1 = in_ST2;
              lVar2 = in_ST2;
              fmal();
              local_b8 = in_ST0;
              fmal();
              local_48 = local_b8;
              local_3c = in_ST1;
              in_ST0 = in_ST2;
              in_ST1 = lVar1;
              in_ST2 = lVar2;
            }
            st = st + 1;
            key = key + 1;
          } while (st <= end);
          dVar3 = (double)local_b8;
          local_3c = local_3c / local_a4;
        }
        *x_mean = dVar3;
        *x_sd = (double)SQRT(local_3c);
        return;
      }
    }
    else {
      local_88 = SUB108(local_48,0);
      uStack_80 = (ushort)((unkuint10)local_48 >> 0x40);
      if ((end < st) || ((~uStack_80 & 0x7fff) != 0 || local_88 != -0x8000000000000000))
      goto LAB_0028a392;
    }
    st = st + 1;
    key = key + 1;
  } while( true );
}

Assistant:

void calc_mean_and_sd_weighted(size_t ix_arr[], size_t st, size_t end, real_t_ *restrict x, mapping &restrict w,
                               MissingAction missing_action, double &restrict x_sd, double &restrict x_mean)
{
    ldouble_safe cnt = 0;
    ldouble_safe w_this;
    ldouble_safe m = 0;
    ldouble_safe s = 0;
    ldouble_safe m_prev = x[ix_arr[st]];
    ldouble_safe xval;
    while (is_na_or_inf(m_prev) && st <= end)
    {
        m_prev = x[ix_arr[++st]];
    }

    for (size_t row = st; row <= end; row++)
    {
        xval = x[ix_arr[row]];
        if (likely(!is_na_or_inf(xval)))
        {
            w_this = w[ix_arr[row]];
            cnt += w_this;
            m = std::fma(w_this, (xval - m) / cnt, m);
            s = std::fma(w_this, (xval - m) * (xval - m_prev), s);
            m_prev = m;
        }
    }

    x_mean = m;
    x_sd   = std::sqrt((ldouble_safe)s / (ldouble_safe)cnt);
}